

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_call.hpp
# Opt level: O0

void squall::detail::call_setup<std::shared_ptr<Foo>>
               (HSQUIRRELVM vm,HSQOBJECT *table,string *name,shared_ptr<Foo> *args)

{
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  SQChar *s;
  SQRESULT SVar1;
  squirrel_error *psVar2;
  SQInteger in_stack_ffffffffffffff18;
  HSQUIRRELVM in_stack_ffffffffffffff20;
  HSQUIRRELVM pSVar3;
  HSQUIRRELVM in_stack_ffffffffffffff28;
  shared_ptr<Foo> *this;
  HSQUIRRELVM in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  SQBool in_stack_ffffffffffffff58;
  SQInteger in_stack_ffffffffffffff60;
  HSQUIRRELVM in_stack_ffffffffffffff68;
  shared_ptr<Foo> local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_65;
  string local_58 [32];
  undefined8 local_38;
  SQObjectValue local_30;
  shared_ptr<Foo> *local_28;
  shared_ptr<Foo> *args_local;
  string *name_local;
  HSQOBJECT *table_local;
  HSQUIRRELVM vm_local;
  
  local_38 = *(undefined8 *)table;
  local_30 = table->_unVal;
  obj._unVal.nInteger._0_7_ = in_stack_ffffffffffffff50;
  obj._0_8_ = in_stack_ffffffffffffff48;
  obj._unVal.nInteger._7_1_ = in_stack_ffffffffffffff57;
  local_28 = args;
  args_local = (shared_ptr<Foo> *)name;
  name_local = (string *)table;
  table_local = (HSQOBJECT *)vm;
  sq_pushobject(in_stack_ffffffffffffff40,obj);
  pSVar3 = (HSQUIRRELVM)table_local;
  s = (SQChar *)std::__cxx11::string::data();
  std::__cxx11::string::length();
  sq_pushstring((HSQUIRRELVM)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),s,
                (SQInteger)pSVar3);
  SVar1 = sq_get(in_stack_ffffffffffffff28,(SQInteger)in_stack_ffffffffffffff20);
  if (SVar1 < 0) {
    local_65 = 1;
    psVar2 = (squirrel_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "can\'t find such function: ");
    squirrel_error::squirrel_error(psVar2,local_58);
    local_65 = 0;
    __cxa_throw(psVar2,&squirrel_error::typeinfo,squirrel_error::~squirrel_error);
  }
  sq_remove(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_78 = *(undefined8 *)name_local;
  uStack_70 = *(undefined8 *)(name_local + 8);
  obj_00._unVal.nInteger._0_7_ = in_stack_ffffffffffffff50;
  obj_00._0_8_ = s;
  obj_00._unVal.nInteger._7_1_ = in_stack_ffffffffffffff57;
  sq_pushobject(pSVar3,obj_00);
  this = &local_88;
  pSVar3 = (HSQUIRRELVM)table_local;
  std::shared_ptr<Foo>::shared_ptr(this,args);
  call_setup_arg<std::shared_ptr<Foo>>(pSVar3,this);
  std::shared_ptr<Foo>::~shared_ptr(&local_88);
  SVar1 = sq_call(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                  CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  if (SVar1 < 0) {
    psVar2 = (squirrel_error *)__cxa_allocate_exception(0x10);
    std::operator+(&stack0xffffffffffffff58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "function call failed: ");
    squirrel_error::squirrel_error(psVar2,(string *)&stack0xffffffffffffff58);
    __cxa_throw(psVar2,&squirrel_error::typeinfo,squirrel_error::~squirrel_error);
  }
  return;
}

Assistant:

inline
void call_setup(HSQUIRRELVM vm, const HSQOBJECT& table,
                const string& name, T... args) {

    sq_pushobject(vm, table);
    sq_pushstring(vm, name.data(), name.length());
    if (!SQ_SUCCEEDED(sq_get(vm, -2))) {
        throw squirrel_error(_SC("can't find such function: ") + name);
    }

    sq_remove(vm, -2);
    sq_pushobject(vm, table);
    call_setup_arg(vm, args...);
    if (!SQ_SUCCEEDED(sq_call(vm, sizeof...(args)+1, SQTrue, SQTrue))) {
        throw squirrel_error(_SC("function call failed: ") + name);
    }
}